

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O1

Abc_Ntk_t * Mop_ManTest(char *pFileName,int fMerge,int fVerbose)

{
  ulong uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Wrd_t *pVVar5;
  word *pwVar6;
  long lVar7;
  Mop_Man_t *p;
  Abc_Ntk_t *pAVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  
  p = Mop_ManRead(pFileName);
  if (p == (Mop_Man_t *)0x0) {
    pAVar8 = (Abc_Ntk_t *)0x0;
  }
  else {
    pVVar3 = p->vCubes;
    uVar11 = pVVar3->nSize;
    uVar12 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar9 = 0;
    }
    else {
      piVar4 = pVVar3->pArray;
      pVVar5 = p->vWordsOut;
      lVar10 = 0;
      uVar9 = 0;
      do {
        iVar2 = piVar4[lVar10];
        uVar11 = p->nWordsOut;
        uVar13 = uVar11 * iVar2;
        if (((int)uVar13 < 0) || (pVVar5->nSize <= (int)uVar13)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        if (0 < (int)uVar11) {
          pwVar6 = pVVar5->pArray;
          if (pwVar6[uVar13] == 0) {
            uVar14 = 0;
            do {
              if ((ulong)uVar11 - 1 == uVar14) goto LAB_00337d6a;
              uVar1 = uVar14 + 1;
              lVar7 = uVar14 + 1;
              uVar14 = uVar1;
            } while (pwVar6[(ulong)uVar13 + lVar7] == 0);
            if (uVar11 <= uVar1) goto LAB_00337d6a;
          }
          if (((int)uVar9 < 0) || ((int)uVar12 <= (int)uVar9)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          uVar12 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
          piVar4[uVar12] = iVar2;
        }
LAB_00337d6a:
        lVar10 = lVar10 + 1;
        uVar11 = pVVar3->nSize;
        uVar12 = (ulong)(int)uVar11;
      } while (lVar10 < (long)uVar12);
    }
    if ((int)uVar11 < (int)uVar9) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    pVVar3->nSize = uVar9;
    if (fMerge == 0) {
      Mop_ManReduce(p);
    }
    else {
      Mop_ManReduce2(p);
    }
    pAVar8 = Mop_ManDerive(p,pFileName);
    Mop_ManStop(p);
  }
  return pAVar8;
}

Assistant:

Abc_Ntk_t * Mop_ManTest( char * pFileName, int fMerge, int fVerbose )
{
    Abc_Ntk_t * pNtk = NULL;
    Mop_Man_t * p = Mop_ManRead( pFileName );
    if ( p == NULL )
        return NULL;
    Mop_ManRemoveEmpty( p );
    //Mop_ManPrint( p );
    if ( fMerge )
        Mop_ManReduce2( p );
    else
        Mop_ManReduce( p );
    //Mop_ManPrint( p );
    pNtk = Mop_ManDerive( p, pFileName );
    Mop_ManStop( p );
    return pNtk;
}